

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O0

Bridges * __thiscall
Graph::determined_bridges_search(Bridges *__return_storage_ptr__,Graph *this,bool param_1)

{
  size_type sVar1;
  reference pvVar2;
  ulong local_30;
  uint64_t i;
  uint64_t timer;
  Graph *pGStack_18;
  bool param_1_local;
  Graph *this_local;
  
  timer._7_1_ = param_1;
  pGStack_18 = this;
  this_local = (Graph *)__return_storage_ptr__;
  clear(this);
  i = 0;
  local_30 = 0;
  while( true ) {
    sVar1 = std::vector<Graph::Colors,_std::allocator<Graph::Colors>_>::size(&this->colorMap);
    if (sVar1 <= local_30) break;
    pvVar2 = std::vector<Graph::Colors,_std::allocator<Graph::Colors>_>::operator[]
                       (&this->colorMap,local_30);
    if (*pvVar2 != Black) {
      dfsForDeterm(this,local_30,&i,0xffffffffffffffff);
    }
    local_30 = local_30 + 1;
  }
  std::vector<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>::vector
            (__return_storage_ptr__,&this->bridges);
  return __return_storage_ptr__;
}

Assistant:

Graph::Bridges Graph::determined_bridges_search(bool) {
    clear();
    std::uint64_t timer = 0;
    for (std::uint64_t i = 0; i < colorMap.size(); ++i)
        if (colorMap[i] != Colors::Black)
            Graph::dfsForDeterm(i, timer);
    return bridges;
}